

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

Array<char,_void_(*)(char_*,_unsigned_long)> * __thiscall
Corrade::Containers::Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_>::
operator*(Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *this)

{
  ostream *output;
  Flags local_39;
  Error local_38;
  Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *local_10;
  Optional<Corrade::Containers::Array<char,_void_(*)(char_*,_unsigned_long)>_> *this_local;
  
  if ((this->_set & 1U) == 0) {
    local_10 = this;
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_39);
    Utility::Error::Error(&local_38,output,local_39);
    Utility::Debug::operator<<(&local_38.super_Debug,"Containers::Optional: the optional is empty");
    Utility::Error::~Error(&local_38);
    abort();
  }
  return (Array<char,_void_(*)(char_*,_unsigned_long)> *)this;
}

Assistant:

const T& operator*() const & {
            CORRADE_DEBUG_ASSERT(_set, "Containers::Optional: the optional is empty", _value);
            return _value;
        }